

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRSharedLibrary.cpp
# Opt level: O2

void __thiscall MinVR::VRSharedLibrary::unload(VRSharedLibrary *this)

{
  int iVar1;
  char *__rhs;
  allocator<char> local_e7;
  allocator<char> local_e6;
  allocator<char> local_e5;
  int local_e4;
  string local_e0;
  string local_c0;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (this->_isLoaded == true) {
    dlerror();
    iVar1 = dlclose(this->_lib);
    __rhs = (char *)dlerror();
    if (iVar1 == 0) {
      this->_isLoaded = false;
    }
    else {
      std::operator+(&local_40,"Could not unload library: ",&this->_filePath);
      std::operator+(&local_80,&local_40," - ");
      std::operator+(&local_60,&local_80,__rhs);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"",&local_e5);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c0,
                 "/workspace/llm4binary/github/license_c_cmakelists/MinVR[P]MinVR/src/plugin/VRSharedLibrary.cpp"
                 ,&local_e6);
      local_e4 = 0x87;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e0,"void MinVR::VRSharedLibrary::unload()",&local_e7);
      VRError::VRWarning(&local_60,&local_a0,&local_c0,&local_e4,&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_40);
    }
  }
  return;
}

Assistant:

void VRSharedLibrary::unload() {
	if (_isLoaded)
	{
		const char* error = "";
#if defined(WIN32)
		BOOL result = FreeLibrary(_lib);

		if (result != 0) {

			LPVOID lpMsgBuf;
			DWORD dw = GetLastError();

			FormatMessage(
				FORMAT_MESSAGE_ALLOCATE_BUFFER |
				FORMAT_MESSAGE_FROM_SYSTEM |
				FORMAT_MESSAGE_IGNORE_INSERTS,
				NULL,
				dw,
				MAKELANGID(LANG_NEUTRAL, SUBLANG_DEFAULT),
				(LPTSTR)&lpMsgBuf,
				0, NULL);

			error = static_cast<const char *>(lpMsgBuf);
		}
#else
		dlerror();
		int result = dlclose(_lib);
		error = dlerror();
#endif
		if(result != 0) {
      VRWARNINGNOADV("Could not unload library: " + _filePath + " - " + error);
			return;
		}

		_isLoaded = false;
	}
}